

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

void PrintExprTrinary(FLispString *out,ZCC_TreeNode *node)

{
  OpenExprType(out,*(EZCCExprType *)&node[1].SiblingNext);
  PrintNodes(out,(ZCC_TreeNode *)node[1].SourceName,true,false);
  PrintNodes(out,*(ZCC_TreeNode **)&node[1].SourceLoc,true,false);
  PrintNodes(out,node[2].SiblingNext,true,false);
  FLispString::Close(out);
  return;
}

Assistant:

static void PrintExprTrinary(FLispString &out, ZCC_TreeNode *node)
{
	ZCC_ExprTrinary *enode = (ZCC_ExprTrinary *)node;
	OpenExprType(out, enode->Operation);
	PrintNodes(out, enode->Test);
	PrintNodes(out, enode->Left);
	PrintNodes(out, enode->Right);
	out.Close();
}